

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

string * duckdb::RenderTitleCase(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  string sStack_38;
  
  StringUtil::Lower(&sStack_38,str);
  ::std::__cxx11::string::operator=((string *)str,(string *)&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  iVar3 = toupper((int)*(str->_M_dataplus)._M_p);
  cVar2 = NumericCastImpl<char,_int,_false>::Convert(iVar3);
  *(str->_M_dataplus)._M_p = cVar2;
  uVar4 = 0;
  while (uVar4 < str->_M_string_length) {
    pcVar1 = (str->_M_dataplus)._M_p;
    if (pcVar1[uVar4] == '_') {
      pcVar1[uVar4] = ' ';
      uVar4 = uVar4 + 1;
      if (uVar4 < str->_M_string_length) {
        iVar3 = toupper((int)(str->_M_dataplus)._M_p[uVar4]);
        cVar2 = NumericCastImpl<char,_int,_false>::Convert(iVar3);
        (str->_M_dataplus)._M_p[uVar4] = cVar2;
      }
    }
    else {
      uVar4 = uVar4 + 1;
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

static string RenderTitleCase(string str) {
	str = StringUtil::Lower(str);
	str[0] = NumericCast<char>(toupper(str[0]));
	for (idx_t i = 0; i < str.size(); i++) {
		if (str[i] == '_') {
			str[i] = ' ';
			if (i + 1 < str.size()) {
				str[i + 1] = NumericCast<char>(toupper(str[i + 1]));
			}
		}
	}
	return str;
}